

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,int startpos,int endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  byte *pbVar1;
  ostringstream *this_00;
  uint uVar2;
  RE2 *pRVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  ostream *poVar8;
  Prog *pPVar9;
  long lVar10;
  StringPiece *match0;
  byte *pbVar11;
  int *piVar12;
  StringPiece *src;
  StringPiece *src_00;
  StringPiece *src_01;
  StringPiece *src_02;
  StringPiece *src_03;
  StringPiece *src_04;
  StringPiece *src_05;
  StringPiece *src_06;
  StringPiece *src_07;
  StringPiece *src_08;
  StringPiece *src_09;
  StringPiece *src_10;
  StringPiece *src_11;
  size_t __n;
  byte bVar13;
  int iVar14;
  byte bVar15;
  byte *__s1;
  MatchKind kind;
  ulong uVar16;
  Anchor anchor;
  StringPiece *text_00;
  uint uVar17;
  size_type sVar18;
  Anchor AVar19;
  ulong uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  bool dfa_failed;
  char local_271;
  RE2 *local_270;
  StringPiece *local_268;
  string local_260;
  char *local_240;
  long local_238;
  char local_230 [16];
  byte *local_220;
  StringPiece local_218;
  StringPiece *local_208;
  StringPiece local_200;
  MatchKind local_1ec;
  ulong local_1e8;
  Options *local_1e0;
  StringPiece match;
  LogMessage local_1c0;
  pointer local_40;
  undefined4 local_38;
  
  if ((this->error_code_ != NoError) || (this->suffix_regexp_ == (Regexp *)0x0)) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x222,2
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,(this->error_->_M_dataplus)._M_p,
               this->error_->_M_string_length);
    goto LAB_00129225;
  }
  if ((endpos < startpos || startpos < 0) || (text->length_ < endpos)) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x228,2
              );
    this_00 = &local_1c0.str_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"RE2: invalid startpos, endpos pair. [",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"startpos: ",10);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)this_00,startpos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"endpos: ",8);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,endpos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"text size: ",0xb);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,text->length_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    goto LAB_00129225;
  }
  local_220 = (byte *)(text->ptr_ + (uint)startpos);
  local_218.length_ = (int)*(undefined8 *)&text->length_;
  iVar14 = (endpos - (text->length_ + startpos)) + local_218.length_;
  local_218._12_4_ = SUB84((ulong)*(undefined8 *)&text->length_ >> 0x20,0);
  local_218.length_ = iVar14;
  match.ptr_ = (char *)0x0;
  match.length_ = 0;
  match0 = (StringPiece *)0x0;
  if (nsubmatch != 0) {
    match0 = &match;
  }
  local_268 = submatch;
  local_218.ptr_ = (char *)local_220;
  local_208 = text;
  iVar5 = NumberOfCapturingGroups(this);
  uVar2 = iVar5 + 1;
  if (nsubmatch <= iVar5) {
    uVar2 = nsubmatch;
  }
  uVar16 = (ulong)uVar2;
  pPVar9 = this->prog_;
  bVar4 = pPVar9->anchor_start_;
  if ((startpos != 0 & bVar4) != 0) {
    return false;
  }
  if ((bVar4 == false) || (uVar20 = 2, pPVar9->anchor_end_ == false)) {
    AVar19 = ANCHOR_START;
    if (bVar4 == false) {
      AVar19 = re_anchor;
    }
    uVar20 = (ulong)AVar19;
    if (re_anchor == ANCHOR_BOTH) {
      uVar20 = 2;
    }
  }
  sVar18 = (this->prefix_)._M_string_length;
  uVar17 = (uint)sVar18;
  iVar5 = (int)uVar20;
  local_270 = this;
  if (sVar18 == 0) {
    local_1e0 = &this->options_;
    kind = (MatchKind)(this->options_).longest_match_;
    bVar13 = (int)uVar2 < 6 & this->is_one_pass_;
    local_271 = pPVar9->size_ < 0x1f5;
    local_220 = (byte *)CONCAT44(local_220._4_4_,(int)(0x40000 / (long)pPVar9->size_));
    dfa_failed = false;
    if (iVar5 == 1) {
LAB_001293dd:
      sVar18 = 0;
      uVar17 = 0;
      bVar15 = bVar13;
      goto joined_r0x001293eb;
    }
    if (iVar5 == 2) {
      kind = kFullMatch;
      goto LAB_001293dd;
    }
    text_00 = &local_218;
    local_1ec = kind;
    local_1e8 = uVar16;
    bVar4 = Prog::SearchDFA(pPVar9,text_00,local_208,kUnanchored,kind,match0,&dfa_failed,
                            (vector<int,_std::allocator<int>_> *)0x0);
    pRVar3 = local_270;
    if (!bVar4) {
      if (dfa_failed != true) {
        if (FLAGS_trace_re2 == 0) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x282,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_200.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
        local_200.length_ = (int)(pRVar3->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03)
                        );
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_03);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," used DFA - no match.",0x15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        goto LAB_00129225;
      }
      if (FLAGS_trace_re2 != 0) {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x27c,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
        local_200.length_ = (int)(local_270->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02)
                        );
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_02);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," DFA failed.",0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        LogMessage::~LogMessage(&local_1c0);
      }
      anchor = kUnanchored;
      uVar17 = 0;
      uVar16 = local_1e8;
      kind = local_1ec;
      goto LAB_00129f3f;
    }
    if (FLAGS_trace_re2 == 1) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x288
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
      local_200.length_ = (int)(local_270->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_00);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," used DFA - match",0x11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      LogMessage::~LogMessage(&local_1c0);
    }
    if (nsubmatch == 0) {
      return true;
    }
    pPVar9 = ReverseProg(local_270);
    if (pPVar9 == (Prog *)0x0) {
      return false;
    }
    bVar4 = Prog::SearchDFA(pPVar9,&match,local_208,kAnchored,kLongestMatch,&match,&dfa_failed,
                            (vector<int,_std::allocator<int>_> *)0x0);
    pRVar3 = local_270;
    if (bVar4) {
      if (FLAGS_trace_re2 == 1) {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x2a7,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
        local_200.length_ = (int)(local_270->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)
                        );
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_01);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," used reverse DFA.",0x12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        LogMessage::~LogMessage(&local_1c0);
      }
      uVar17 = 0;
      uVar16 = local_1e8;
      goto LAB_00129c8a;
    }
    if (dfa_failed != true) {
      if (FLAGS_trace_re2 != 0) {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x29f,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_200.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
        local_200.length_ = (int)(pRVar3->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11)
                        );
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_11);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," DFA inconsistency.",0x13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        LogMessage::~LogMessage(&local_1c0);
      }
      if ((pRVar3->options_).log_errors_ != true) {
        return false;
      }
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2a3
                 ,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c0.str_,"DFA inconsistency",0x11);
      goto LAB_00129225;
    }
    if (FLAGS_trace_re2 != 0) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x299
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_200.ptr_ = (pRVar3->pattern_)._M_dataplus._M_p;
      local_200.length_ = (int)(pRVar3->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," reverse DFA failed.",0x14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      LogMessage::~LogMessage(&local_1c0);
    }
    uVar20 = CONCAT71((int7)((ulong)pRVar3 >> 8),1);
    uVar17 = 0;
    anchor = kUnanchored;
    uVar16 = local_1e8;
    kind = local_1ec;
  }
  else {
    if (startpos != 0) {
      return false;
    }
    if (iVar14 < (int)uVar17) {
      return false;
    }
    __s1 = (byte *)(this->prefix_)._M_dataplus._M_p;
    __n = (size_t)(int)uVar17;
    if (this->prefix_foldcase_ == true) {
      if (0 < (int)uVar17) {
        pbVar1 = __s1 + __n;
        pbVar11 = local_220;
        do {
          bVar13 = *pbVar11;
          bVar15 = bVar13 | 0x20;
          if (0x19 < (byte)(bVar13 + 0xbf)) {
            bVar15 = bVar13;
          }
          if (*__s1 != bVar15) {
            return false;
          }
          __s1 = __s1 + 1;
          pbVar11 = pbVar11 + 1;
        } while (__s1 < pbVar1);
      }
    }
    else {
      iVar6 = bcmp(__s1,local_220,__n);
      if (iVar6 != 0) {
        return false;
      }
    }
    local_218.ptr_ = (char *)(local_220 + __n);
    local_218.length_ = iVar14 - uVar17;
    local_1e0 = &local_270->options_;
    if (iVar5 == 2) {
      iVar14 = pPVar9->size_;
      uVar7 = (undefined4)(0x40000 / (long)iVar14);
      kind = kFullMatch;
    }
    else {
      kind = (MatchKind)(local_270->options_).longest_match_;
      iVar14 = pPVar9->size_;
      uVar7 = (undefined4)(0x40000 / (long)iVar14);
    }
    local_220 = (byte *)CONCAT44(local_220._4_4_,uVar7);
    local_271 = iVar14 < 0x1f5;
    bVar15 = local_270->is_one_pass_ & (int)uVar2 < 6;
joined_r0x001293eb:
    bVar13 = 0;
    if (bVar15 == 0) {
LAB_00129b09:
      dfa_failed = false;
      if (((bool)local_271 == false) || ((int)uVar2 < 2 || (int)local_220 < local_208->length_)) {
        uVar20 = 0;
        bVar4 = Prog::SearchDFA(pPVar9,&local_218,local_208,kAnchored,kind,&match,&dfa_failed,
                                (vector<int,_std::allocator<int>_> *)0x0);
        if (bVar4) {
LAB_00129c8a:
          iVar14 = (int)uVar16;
          if (iVar14 < 2) {
            if (iVar14 == 1) {
              local_268->length_ = match.length_;
              local_268->ptr_ = match.ptr_;
            }
            goto LAB_0012a471;
          }
          anchor = kAnchored;
          uVar20 = 0;
          text_00 = &match;
          kind = kFullMatch;
          goto LAB_00129f4a;
        }
        if (dfa_failed != true) {
          if (FLAGS_trace_re2 == 0) {
            return false;
          }
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2d6,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
          local_200.length_ = (int)(local_270->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_06);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," used DFA - no match.",0x15);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          goto LAB_00129225;
        }
        anchor = kAnchored;
        if (FLAGS_trace_re2 != 0) {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2cf,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
          local_200.length_ = (int)(local_270->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_05);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," DFA failed.",0xc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          goto LAB_00129dc6;
        }
      }
      else {
        anchor = kAnchored;
        local_271 = '\x01';
        if (FLAGS_trace_re2 == 1) {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2c5,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
          local_200.length_ = (int)(local_270->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_04);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," skipping DFA for BitState.",0x1b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
LAB_00129dc6:
          LogMessage::~LogMessage(&local_1c0);
LAB_00129dde:
          uVar20 = 0;
          anchor = kAnchored;
        }
      }
    }
    else {
      dfa_failed = false;
      uVar17 = (uint)sVar18;
      bVar13 = 1;
      if ((0x1000 < local_208->length_) || ((int)uVar2 < 2 && 8 < local_208->length_))
      goto LAB_00129b09;
      anchor = kAnchored;
      bVar13 = 1;
      if (FLAGS_trace_re2 == 1) {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x2bd,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_200.ptr_ = (local_270->pattern_)._M_dataplus._M_p;
        local_200.length_ = (int)(local_270->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," skipping DFA for OnePass.",0x1a)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        LogMessage::~LogMessage(&local_1c0);
        goto LAB_00129dde;
      }
    }
LAB_00129f3f:
    uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
    text_00 = &local_218;
  }
LAB_00129f4a:
  local_200.length_ = text_00->length_;
  local_200.ptr_ = text_00->ptr_;
  iVar14 = (int)uVar16;
  if (bVar13 == 1 && anchor != kUnanchored) {
    if (FLAGS_trace_re2 == 1) {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2f3
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_40 = (local_270->pattern_)._M_dataplus._M_p;
      local_38 = (undefined4)(local_270->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_07);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," using OnePass.",0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      LogMessage::~LogMessage(&local_1c0);
      uVar20 = uVar20 & 0xffffffff;
    }
    bVar4 = Prog::SearchOnePass(local_270->prog_,&local_200,local_208,kAnchored,kind,local_268,
                                iVar14);
    if (bVar4) goto LAB_0012a471;
    if ((char)uVar20 != '\0') {
      return false;
    }
    if (local_1e0->log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2f8,2
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,"SearchOnePass inconsistency",0x1b);
  }
  else if ((local_271 == '\0') || ((int)local_220 < text_00->length_)) {
    if ((FLAGS_trace_re2 & 1) != 0) {
      local_220 = (byte *)CONCAT44(local_220._4_4_,(int)uVar20);
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x308
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_40 = (local_270->pattern_)._M_dataplus._M_p;
      local_38 = (undefined4)(local_270->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_09);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," using NFA.",0xb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      LogMessage::~LogMessage(&local_1c0);
      uVar20 = (ulong)local_220 & 0xffffffff;
    }
    bVar4 = Prog::SearchNFA(local_270->prog_,&local_200,local_208,anchor,kind,local_268,iVar14);
    if (bVar4) goto LAB_0012a471;
    if ((char)uVar20 != '\0') {
      return false;
    }
    if (local_1e0->log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x30d,2
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,"SearchNFA inconsistency",0x17);
  }
  else {
    if ((FLAGS_trace_re2 & 1) != 0) {
      local_220 = (byte *)CONCAT44(local_220._4_4_,(int)uVar20);
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2fd
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_40 = (local_270->pattern_)._M_dataplus._M_p;
      local_38 = (undefined4)(local_270->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_08);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," using BitState.",0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      LogMessage::~LogMessage(&local_1c0);
      uVar20 = (ulong)local_220 & 0xffffffff;
    }
    bVar4 = Prog::SearchBitState(local_270->prog_,&local_200,local_208,anchor,kind,local_268,iVar14)
    ;
    if (bVar4) {
LAB_0012a471:
      if ((0 < nsubmatch) && (0 < (int)uVar17)) {
        local_268->ptr_ = local_268->ptr_ + -(ulong)uVar17;
        local_268->length_ = local_268->length_ + uVar17;
      }
      if (iVar14 < nsubmatch) {
        lVar10 = (long)nsubmatch - (long)iVar14;
        piVar12 = &local_268[iVar14].length_;
        do {
          ((StringPiece *)(piVar12 + -2))->ptr_ = (char *)0x0;
          *piVar12 = 0;
          piVar12 = piVar12 + 4;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      return true;
    }
    if ((char)uVar20 != '\0') {
      return false;
    }
    if (local_1e0->log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x303,2
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,"SearchBitState inconsistency",0x1c);
  }
LAB_00129225:
  LogMessage::~LogMessage(&local_1c0);
  return false;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                int startpos,
                int endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok() || suffix_regexp_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos < 0 || startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  int prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = static_cast<int>(prefix_.size());
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // SearchBitState allocates a bit vector of size prog_->size() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->size() * text.size() but in practice is much
  // smaller.
  // Conditions for using SearchBitState:
  const int MaxBitStateProg = 500;   // prog_->size() <= Max.
  const int MaxBitStateVector = 256*1024;  // bit vector size <= Max (bits)
  bool can_bit_state = prog_->size() <= MaxBitStateProg;
  int bit_state_text_max = MaxBitStateVector / prog_->size();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used DFA - match";
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " reverse DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " DFA inconsistency.";
        if (options_.log_errors())
          LOG(ERROR) << "DFA inconsistency";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used reverse DFA.";
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for OnePass.";
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for BitState.";
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          skipped_test = true;
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using OnePass.";
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using BitState.";
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using NFA.";
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].begin() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = NULL;
  return true;
}